

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O3

void __thiscall Dinic_Graph1_Test::~Dinic_Graph1_Test(Dinic_Graph1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Dinic, Graph1) {
    Dinic d(7);
    d.addEdge(0, 1, 3);
    d.addEdge(0, 2, 1);
    d.addEdge(1, 3, 3);
    d.addEdge(2, 3, 5);
    d.addEdge(2, 5, 4);
    d.addEdge(3, 4, 2);
    d.addEdge(5, 6, 2);
    d.addEdge(6, 4, 3);
    ll f = d.getFlow(0, 4);
    
    EXPECT_EQ(3, f);
    // e[2n] corresponds to edge n, e[2n+1] to the backwards edge
    EXPECT_EQ(2, d.e[0].flow);
    EXPECT_EQ(1, d.e[2].flow);
    EXPECT_EQ(2, d.e[4].flow);
    EXPECT_EQ(0, d.e[6].flow);
}